

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaTabBar::mousePressEvent(QMdiAreaTabBar *this,QMouseEvent *event)

{
  int index;
  QWidget *this_00;
  long in_FS_OFFSET;
  QPointF local_30;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(event + 0x40) == 4) {
    local_30 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_20 = QPointF::toPoint(&local_30);
    index = QTabBar::tabAt(&this->super_QTabBar,&local_20);
    this_00 = &subWindowFromIndex(this,index)->super_QWidget;
    if (this_00 == (QWidget *)0x0) {
      event[0xc] = (QMouseEvent)0x0;
    }
    else {
      QWidget::close(this_00,index);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QTabBar::mousePressEvent(&this->super_QTabBar,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaTabBar::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::MiddleButton) {
        QTabBar::mousePressEvent(event);
        return;
    }

    QMdiSubWindow *subWindow = subWindowFromIndex(tabAt(event->position().toPoint()));
    if (!subWindow) {
        event->ignore();
        return;
    }

    subWindow->close();
}